

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O2

void * __thiscall TCMalloc_PageMap2<35>::Next(TCMalloc_PageMap2<35> *this,Number k)

{
  void *pvVar1;
  ulong uVar2;
  
  do {
    if (0x7ffffffff < k) {
      return (void *)0x0;
    }
    if (this->root_[k >> 0x12] != (Leaf *)0x0) {
      uVar2 = (ulong)((uint)k & 0x3ffff);
      while (uVar2 != 0x40000) {
        pvVar1 = this->root_[k >> 0x12]->values[uVar2];
        uVar2 = uVar2 + 1;
        if (pvVar1 != (void *)0x0) {
          return pvVar1;
        }
      }
    }
    k = (k & 0x7fffc0000) + 0x40000;
  } while( true );
}

Assistant:

void* Next(Number k) const {
    while (k < (Number(1) << BITS)) {
      const Number i1 = k >> LEAF_BITS;
      Leaf* leaf = root_[i1];
      if (leaf != nullptr) {
        // Scan forward in leaf
        for (Number i2 = k & (LEAF_LENGTH - 1); i2 < LEAF_LENGTH; i2++) {
          if (leaf->values[i2] != nullptr) {
            return leaf->values[i2];
          }
        }
      }
      // Skip to next top-level entry
      k = (i1 + 1) << LEAF_BITS;
    }
    return nullptr;
  }